

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11.cpp
# Opt level: O3

void __thiscall tcu::x11::XlibWindow::~XlibWindow(XlibWindow *this)

{
  (this->super_WindowBase)._vptr_WindowBase = (_func_int **)&PTR__XlibWindow_00cf29b0;
  XDestroyWindow(this->m_display->m_display,this->m_window);
  if (this->m_colormap != 0) {
    XFreeColormap(this->m_display->m_display);
  }
  return;
}

Assistant:

XlibWindow::~XlibWindow (void)
{
	XDestroyWindow(m_display.getXDisplay(), m_window);
	if (m_colormap != None)
		XFreeColormap(m_display.getXDisplay(), m_colormap);
}